

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::timeout_handler::set_timeout
          (timeout_handler *this,int completion_timeout,int read_timeout)

{
  int *piVar1;
  int local_94;
  enable_shared_from_this<libtorrent::aux::timeout_handler> local_78;
  code *local_68;
  undefined8 local_60;
  type local_58;
  duration<long,std::ratio<1l,1l>> local_38 [8];
  time_point local_30;
  int local_24;
  rep rStack_20;
  int timeout;
  int local_18;
  int local_14;
  int read_timeout_local;
  int completion_timeout_local;
  timeout_handler *this_local;
  
  this->m_completion_timeout = completion_timeout;
  this->m_read_timeout = read_timeout;
  local_18 = read_timeout;
  local_14 = completion_timeout;
  _read_timeout_local = this;
  rStack_20 = ::std::chrono::_V2::system_clock::now();
  (this->m_read_time).__d.__r = rStack_20;
  (this->m_start_time).__d.__r = (this->m_read_time).__d.__r;
  if ((this->m_abort & 1U) == 0) {
    local_24 = 0;
    if (0 < this->m_read_timeout) {
      local_24 = this->m_read_timeout;
    }
    if (0 < this->m_completion_timeout) {
      if (local_24 == 0) {
        local_94 = this->m_completion_timeout;
      }
      else {
        piVar1 = ::std::min<int>(&this->m_completion_timeout,&local_24);
        local_94 = *piVar1;
      }
      local_24 = local_94;
    }
    ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_38,&local_24);
    local_30.__d.__r =
         (duration)
         ::std::chrono::operator+
                   (&this->m_read_time,(duration<long,_std::ratio<1L,_1L>_> *)local_38);
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::expires_at(&this->m_timeout,&local_30);
    local_68 = timeout_callback;
    local_60 = 0;
    ::std::enable_shared_from_this<libtorrent::aux::timeout_handler>::shared_from_this(&local_78);
    ::std::
    bind<void(libtorrent::aux::timeout_handler::*)(boost::system::error_code_const&),std::shared_ptr<libtorrent::aux::timeout_handler>,std::_Placeholder<1>const&>
              (&local_58,(offset_in_timeout_handler_to_subr *)&local_68,
               (shared_ptr<libtorrent::aux::timeout_handler> *)&local_78,
               (_Placeholder<1> *)&::std::placeholders::_1);
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
    ::
    async_wait<std::_Bind<void(libtorrent::aux::timeout_handler::*(std::shared_ptr<libtorrent::aux::timeout_handler>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
              ((basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                *)&this->m_timeout,&local_58);
    ::std::
    _Bind<void_(libtorrent::aux::timeout_handler::*(std::shared_ptr<libtorrent::aux::timeout_handler>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
    ::~_Bind(&local_58);
    ::std::shared_ptr<libtorrent::aux::timeout_handler>::~shared_ptr
              ((shared_ptr<libtorrent::aux::timeout_handler> *)&local_78);
  }
  return;
}

Assistant:

void timeout_handler::set_timeout(int completion_timeout, int read_timeout)
	{
		m_completion_timeout = completion_timeout;
		m_read_timeout = read_timeout;
		m_start_time = m_read_time = clock_type::now();

		TORRENT_ASSERT(completion_timeout > 0 || read_timeout > 0);

		if (m_abort) return;

		int timeout = 0;
		if (m_read_timeout > 0) timeout = m_read_timeout;
		if (m_completion_timeout > 0)
		{
			timeout = timeout == 0
				? m_completion_timeout
				: std::min(m_completion_timeout, timeout);
		}

		ADD_OUTSTANDING_ASYNC("timeout_handler::timeout_callback");
		m_timeout.expires_at(m_read_time + seconds(timeout));
		m_timeout.async_wait(std::bind(
			&timeout_handler::timeout_callback, shared_from_this(), _1));
#if TORRENT_USE_ASSERTS
		++m_outstanding_timer_wait;
#endif
	}